

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void calc_data_crc(RK_U8 *dat,RK_U32 len,DataCrc *crc)

{
  uint uVar1;
  ulong uVar2;
  RK_U32 val;
  uint local_1c;
  
  crc->sum_cnt = (uint)(len != 0);
  if (len != 0) {
    wide_bit_sum(dat,len,crc->sum);
  }
  uVar1 = 0;
  for (uVar2 = 0; len >> 2 != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 ^ *(uint *)(dat + uVar2 * 4);
  }
  if ((len & 3) != 0) {
    local_1c = 0;
    for (uVar2 = (ulong)((len >> 2) << 2); uVar2 < len; uVar2 = uVar2 + 1) {
      *(RK_U8 *)((long)&local_1c + (ulong)((uint)uVar2 & 3)) = dat[uVar2];
    }
    uVar1 = uVar1 ^ local_1c;
  }
  crc->len = len;
  crc->vor = uVar1;
  return;
}

Assistant:

void calc_data_crc(RK_U8 *dat, RK_U32 len, DataCrc *crc)
{
    RK_ULONG data_grp_byte_cnt = MAX_HALF_WORD_SUM_CNT * CAL_BYTE;
    RK_U32 i = 0, grp_loop = 0;
    RK_U8 *dat8 = NULL;
    RK_U32 *dat32 = NULL;
    RK_U32 xor = 0;

    /*calc sum */
    crc->sum_cnt = (len + data_grp_byte_cnt - 1) / data_grp_byte_cnt;
    for (grp_loop = 0; grp_loop < len / data_grp_byte_cnt; grp_loop++) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], data_grp_byte_cnt, &crc->sum[grp_loop]);
    }
    if (len % data_grp_byte_cnt) {
        wide_bit_sum(&dat[grp_loop * data_grp_byte_cnt], len % data_grp_byte_cnt, &crc->sum[grp_loop]);
    }

    /*calc xor */
    dat32 = (RK_U32 *)dat;
    for (i = 0; i < len / 4; i++)
        xor ^= dat32[i];

    if (len % 4) {
        RK_U32 val = 0;
        dat8 = (RK_U8 *)&val;
        for (i = (len / 4) * 4; i < len; i++)
            dat8[i % 4] = dat[i];
        xor ^= val;
    }

    crc->len = len;
    crc->vor = xor;
}